

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::BufferStorage::DynamicStorageTest::iterate(DynamicStorageTest *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  Buffer write_buffer;
  Buffer read_buffer;
  GLubyte temp_data [64];
  GLubyte write_data [64];
  GLubyte read_data [64];
  GLubyte update_data [64];
  Buffer local_318;
  Buffer local_300;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Buffer local_2a8;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  string local_268;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  code *local_1c0;
  int local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar7;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  local_248 = 0x101010101010101;
  uStack_240 = 0x101010101010101;
  local_238 = 0x101010101010101;
  uStack_230 = 0x101010101010101;
  local_228 = 0x101010101010101;
  uStack_220 = 0x101010101010101;
  local_218 = 0x101010101010101;
  uStack_210 = 0x101010101010101;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_208 = 0x303030303030303;
  uStack_200 = 0x303030303030303;
  local_1f8 = 0x303030303030303;
  uStack_1f0 = 0x303030303030303;
  local_1e8 = 0x303030303030303;
  uStack_1e0 = 0x303030303030303;
  local_1d8 = 0x303030303030303;
  uStack_1d0 = 0x303030303030303;
  local_2a8.m_id = 0x2020202;
  local_2a8._4_4_ = 0x2020202;
  local_2a8.m_context = (Context *)0x202020202020202;
  local_2a8.m_target = 0x2020202;
  local_2a8._20_4_ = 0x2020202;
  uStack_290 = 0x202020202020202;
  local_288 = 0x202020202020202;
  uStack_280 = 0x202020202020202;
  local_278 = 0x202020202020202;
  uStack_270 = 0x202020202020202;
  local_318.m_context = (this->super_TestCase).m_context;
  local_300.m_id = 0xffffffff;
  local_300.m_target = 0x8892;
  local_318.m_id = 0xffffffff;
  local_318.m_target = 0x8892;
  local_300.m_context = local_318.m_context;
  BufferStorage::Buffer::InitStorage(&local_300,0x8f36,0,0x40,&local_248);
  BufferStorage::Buffer::InitStorage(&local_318,0x8f37,0,0x40,&local_2a8);
  iVar2 = (*(local_318.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x40))(local_318.m_target,local_318.m_id);
  dVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (**(code **)(lVar7 + 0x168))(0x8f37,0,0x40,&local_208);
  iVar2 = (**(code **)(lVar7 + 0x800))();
  if (iVar2 != 0x502) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "Invalid error was generated. BufferSubData was executed on store without DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
               ,0x7f);
    local_1c0 = glu::getErrorName;
    local_1b8 = iVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_1c0);
    _Var1._M_p = local_268._M_dataplus._M_p;
    if (local_268._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
    }
    else {
      sVar8 = strlen(local_268._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,_Var1._M_p,sVar8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  (**(code **)(lVar7 + 0x7b8))(0x8f37,0,0x40,&local_2e8);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"GetBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x2ed);
  iVar4 = bcmp(&local_2e8,&local_2a8,0x40);
  if (iVar4 != 0) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT.",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  iVar5 = (*(local_300.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x40))(local_300.m_target,local_300.m_id);
  dVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar5) + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (**(code **)(lVar7 + 0x308))(0x8f36,0x8f37,0,0,0x40);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"CopyBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8c8);
  (**(code **)(lVar7 + 0x7b8))(0x8f37,0,0x40,&local_2e8);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"GetBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x2ed);
  iVar5 = bcmp(&local_2e8,&local_248,0x40);
  if (iVar5 != 0) {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "CopyBufferSubData stored invalid contents in write target buffer.",0x41);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  BufferStorage::Buffer::~Buffer(&local_318);
  BufferStorage::Buffer::~Buffer(&local_300);
  local_248 = 0;
  uStack_240 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_2e8 = 0x303030303030303;
  uStack_2e0 = 0x303030303030303;
  local_2d8 = 0x303030303030303;
  uStack_2d0 = 0x303030303030303;
  local_2c8 = 0x303030303030303;
  uStack_2c0 = 0x303030303030303;
  local_2b8 = 0x303030303030303;
  uStack_2b0 = 0x303030303030303;
  local_208 = 0x202020202020202;
  uStack_200 = 0x202020202020202;
  local_1f8 = 0x202020202020202;
  uStack_1f0 = 0x202020202020202;
  local_1e8 = 0x202020202020202;
  uStack_1e0 = 0x202020202020202;
  local_1d8 = 0x202020202020202;
  uStack_1d0 = 0x202020202020202;
  local_2a8.m_context = (this->super_TestCase).m_context;
  local_2a8.m_id = 0xffffffff;
  local_2a8.m_target = 0x8892;
  BufferStorage::Buffer::InitStorage(&local_2a8,0x8f37,0x100,0x40,&local_208);
  iVar6 = (*(local_2a8.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x40))
            (local_2a8._16_8_ & 0xffffffff,local_2a8._0_8_ & 0xffffffff);
  dVar3 = (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x800))();
  glu::checkError(dVar3,"BindBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x284);
  (**(code **)(lVar7 + 0x168))(0x8f37,0,0x40,&local_2e8);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"BufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x8f1);
  (**(code **)(lVar7 + 0x7b8))(0x8f37,0,0x40,&local_248);
  dVar3 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar3,"GetBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cBufferStorageTests.cpp"
                  ,0x2ed);
  iVar6 = bcmp(&local_248,&local_2e8,0x40);
  if (iVar6 == 0) {
    BufferStorage::Buffer::~Buffer(&local_2a8);
    if (iVar5 == 0 && (iVar4 == 0 && iVar2 == 0x502)) {
      this_00 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_0087fe32;
    }
  }
  else {
    local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"BufferSubData stored invalid contents in write target buffer."
               ,0x3d);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    BufferStorage::Buffer::~Buffer(&local_2a8);
  }
  this_00 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_0087fe32:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DynamicStorageTest::iterate()
{
	static const size_t data_size = 64;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	/*
	 * - prepare 64 bytes immutable buffer filled with value 1; Bind the buffer to
	 * COPY_READ_BUFFER;
	 * - prepare 64 bytes immutable buffer filled with value 2; Do not set
	 * DYNAMIC_STORAGE_BIT for <flags>; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; INVLIAD_OPERATION error should be generated;
	 * - inspect contents of buffer to verify it is filled with 2;
	 * - execute CopyBufferSubData to transfer data from COPY_READ_BUFFER to
	 * COPY_WRITE_BUFFER; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 1;
	 */
	{
		/* Prepare buffers */
		GLubyte read_data[data_size];
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			read_data[i]   = 1;
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer read_buffer(m_context);
		Buffer write_buffer(m_context);

		read_buffer.InitStorage(GL_COPY_READ_BUFFER, 0 /* flags */, data_size, read_data);
		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, 0 /* flags */, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);

		GLenum error = gl.getError();
		if (GL_INVALID_OPERATION != error)
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Invalid error was generated. BufferSubData was executed on store without "
											"DYNAMIC_STORAGE_BIT. Expected INVALID_OPERATION, got: "
				<< glu::getErrorStr(error).toString().c_str() << tcu::TestLog::EndMessage;
		}

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, write_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BufferSubData modified contents of store without DYNAMIC_STORAGE_BIT."
				<< tcu::TestLog::EndMessage;
		}

		/* Check copyBufferSubData */
		read_buffer.Bind();
		gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0 /* readOffset */, 0 /* writeOffset */,
							 data_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "CopyBufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, read_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "CopyBufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/*
	 * - delete buffer and create new one; This time <flags> should contain
	 * DYNAMIC_STORAGE_BIT; Bind the buffer to COPY_WRITE_BUFFER;
	 * - execute BufferSubData to update COPY_WRITE_BUFFER buffer with 64 bytes
	 * filled with value 3; No error should be generated;
	 * - inspect contents of buffer to verify it is filled with 3;
	 */
	{
		/* Prepare buffers */
		GLubyte temp_data[data_size];
		GLubyte update_data[data_size];
		GLubyte write_data[data_size];

		for (size_t i = 0; i < data_size; ++i)
		{
			temp_data[i]   = 0;
			update_data[i] = 3;
			write_data[i]  = 2;
		}

		Buffer write_buffer(m_context);

		write_buffer.InitStorage(GL_COPY_WRITE_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, write_data);

		/* Check bufferSubData */
		write_buffer.Bind();
		gl.bufferSubData(GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, update_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BufferSubData");

		Buffer::GetSubData(gl, GL_COPY_WRITE_BUFFER, 0 /* offset */, data_size, temp_data);

		if (0 != memcmp(temp_data, update_data, data_size))
		{
			test_result = false;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "BufferSubData stored invalid contents in write target buffer."
												<< tcu::TestLog::EndMessage;
		}
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}